

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

void __thiscall Clasp::mt::SharedLitsClause::toLits(SharedLitsClause *this,LitVec *out)

{
  SharedLiterals *pSVar1;
  
  pSVar1 = (this->super_ClauseHead).field_0.shared_;
  bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
  insert_range<Clasp::Literal_const*>
            ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)out,
             (out->ebo_).buf + (out->ebo_).size,pSVar1 + 1,
             (long)&pSVar1[1].refCount_.super___atomic_base<int>._M_i +
             (ulong)(pSVar1->size_type_ & 0xfffffffc),0);
  return;
}

Assistant:

void SharedLitsClause::toLits(LitVec& out) const {
	out.insert(out.end(), shared_->begin(), shared_->end());
}